

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O2

bool TasOptimization::testParticleSwarm(bool verbose)

{
  bool bVar1;
  bool bVar2;
  vector<double,_std::allocator<double>_> upper;
  vector<double,_std::allocator<double>_> lower;
  DreamDomain local_518;
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  local_4f8;
  function<double_(const_std::vector<double,_std::allocator<double>_>_&)> local_4d8;
  ObjectiveFunction shc;
  DreamDomain local_498;
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  local_478;
  function<double_(const_std::vector<double,_std::allocator<double>_>_&)> local_458;
  ObjectiveFunction l1;
  ObjectiveFunctionSingle shc_single;
  ObjectiveFunctionSingle l1_single;
  code *local_3d0 [2];
  code *local_3c0;
  code *local_3b8;
  code *local_3b0 [2];
  code *local_3a0;
  code *local_398;
  ParticleSwarmState state;
  ParticleSwarmState local_2b8;
  ParticleSwarmState local_1e0;
  ParticleSwarmState local_108;
  
  state.positions_initialized = false;
  state.velocities_initialized = false;
  state.best_positions_initialized = false;
  state.cache_initialized = false;
  state.num_dimensions = -0x3fec0000;
  std::vector<double,_std::allocator<double>_>::vector
            (&lower,6,(value_type_conflict1 *)&state,(allocator_type *)&local_2b8);
  state.positions_initialized = false;
  state.velocities_initialized = false;
  state.best_positions_initialized = false;
  state.cache_initialized = false;
  state.num_dimensions = 0x40000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&upper,6,(value_type_conflict1 *)&state,(allocator_type *)&local_2b8);
  l1_single.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  l1_single.super__Function_base._M_functor._8_8_ = 0;
  l1_single._M_invoker =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:169:13)>
       ::_M_invoke;
  l1_single.super__Function_base._M_manager =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:169:13)>
       ::_M_manager;
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::function
            (&local_458,&l1_single);
  makeObjectiveFunction(&l1,6,&local_458);
  std::_Function_base::~_Function_base(&local_458.super__Function_base);
  TasOptimization::ParticleSwarmState::ParticleSwarmState(&state,6,100);
  local_3b0[1] = (code *)0x0;
  local_3b0[0] = TasDREAM::tsgCoreUniform01;
  local_398 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_3a0 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox(&state,&lower,&upper);
  std::_Function_base::~_Function_base((_Function_base *)local_3b0);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&local_478,&l1);
  ParticleSwarmState::ParticleSwarmState(&local_108,&state);
  TasDREAM::hypercube(&local_498,&lower,&upper);
  bVar1 = testParticleSwarmSingle(&local_478,&local_108,&local_498,300,0.0);
  std::_Function_base::~_Function_base(&local_498.super__Function_base);
  ParticleSwarmState::~ParticleSwarmState(&local_108);
  std::_Function_base::~_Function_base(&local_478.super__Function_base);
  if (!bVar1) {
    std::operator<<((ostream *)&std::cout,
                    "ERROR: failed l1 example for Particle Swarm optimization.\n");
  }
  local_2b8.positions_initialized = false;
  local_2b8.velocities_initialized = false;
  local_2b8.best_positions_initialized = false;
  local_2b8.cache_initialized = false;
  local_2b8.num_dimensions = -0x3ff80000;
  local_2b8.num_particles = 0;
  local_2b8._12_4_ = 0xc0000000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&lower,&local_2b8);
  local_2b8.positions_initialized = false;
  local_2b8.velocities_initialized = false;
  local_2b8.best_positions_initialized = false;
  local_2b8.cache_initialized = false;
  local_2b8.num_dimensions = 0x40080000;
  local_2b8.num_particles = 0;
  local_2b8._12_4_ = 0x40000000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&upper,&local_2b8);
  shc_single.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  shc_single.super__Function_base._M_functor._8_8_ = 0;
  shc_single._M_invoker =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:187:13)>
       ::_M_invoke;
  shc_single.super__Function_base._M_manager =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:187:13)>
       ::_M_manager;
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::function
            (&local_4d8,&shc_single);
  makeObjectiveFunction(&shc,2,&local_4d8);
  std::_Function_base::~_Function_base(&local_4d8.super__Function_base);
  TasOptimization::ParticleSwarmState::ParticleSwarmState(&local_2b8,2,0x32);
  ParticleSwarmState::operator=(&state,&local_2b8);
  ParticleSwarmState::~ParticleSwarmState(&local_2b8);
  local_3d0[1] = (code *)0x0;
  local_3d0[0] = TasDREAM::tsgCoreUniform01;
  local_3b8 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_3c0 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox(&state,&lower,&upper);
  std::_Function_base::~_Function_base((_Function_base *)local_3d0);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&local_4f8,&shc);
  ParticleSwarmState::ParticleSwarmState(&local_1e0,&state);
  TasDREAM::hypercube(&local_518,&lower,&upper);
  bVar2 = testParticleSwarmSingle(&local_4f8,&local_1e0,&local_518,100,-1.031628453489877);
  std::_Function_base::~_Function_base(&local_518.super__Function_base);
  ParticleSwarmState::~ParticleSwarmState(&local_1e0);
  std::_Function_base::~_Function_base(&local_4f8.super__Function_base);
  if (bVar2) {
    if ((bVar1 && bVar2) && !verbose) goto LAB_0011501c;
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "ERROR: failed l1 example for Particle Swarm optimization.\n");
  }
  reportPassFail(bVar1 && bVar2,"Particle Swarm","Algorithm Unit Tests");
LAB_0011501c:
  std::_Function_base::~_Function_base(&shc.super__Function_base);
  std::_Function_base::~_Function_base(&shc_single.super__Function_base);
  ParticleSwarmState::~ParticleSwarmState(&state);
  std::_Function_base::~_Function_base(&l1.super__Function_base);
  std::_Function_base::~_Function_base(&l1_single.super__Function_base);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&upper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lower.super__Vector_base<double,_std::allocator<double>_>);
  return bVar1 && bVar2;
}

Assistant:

bool testParticleSwarm(bool verbose) {
    test_result test;

    // l1 norm over the domain [-5, 2] ^ 6.
    int num_dimensions = 6;
    int num_particles = 100;
    int iterations = 300;
    std::vector<double> lower(num_dimensions, -5.0);
    std::vector<double> upper(num_dimensions, 2.0);
    TasOptimization::ObjectiveFunctionSingle l1_single =
            [](const std::vector<double> &x)->double {
                double sum = 0;
                for (auto xi : x) sum += std::fabs(xi);
                return sum;
            };
    TasOptimization::ObjectiveFunction l1 = TasOptimization::makeObjectiveFunction(num_dimensions, l1_single);
    TasOptimization::ParticleSwarmState state(num_dimensions, num_particles);
    state.initializeParticlesInsideBox(lower, upper);
    test.tassert( testParticleSwarmSingle(l1, state, TasDREAM::hypercube(lower, upper), iterations, 0) );
    if (test.failed_last()) std::cout << "ERROR: failed l1 example for Particle Swarm optimization.\n";

    // Six hump-camel function over the domain [-3, 3] x [-2, 2].
    num_dimensions = 2;
    num_particles = 50;
    iterations = 100;
    lower = {-3.0, -2.0};
    upper = {3.0, 2.0};
    TasOptimization::ObjectiveFunctionSingle shc_single =
            [](const std::vector<double> &x)->double {
                return (4.0 - 2.1 * x[0]*x[0] + x[0]*x[0]*x[0]*x[0] / 3.0) * x[0]*x[0] +
                        x[0] * x[1] +
                        (-4.0 + 4.0 * x[1]*x[1]) * x[1]*x[1];};
    TasOptimization::ObjectiveFunction shc = TasOptimization::makeObjectiveFunction(num_dimensions, shc_single);
    state = ParticleSwarmState(num_dimensions, num_particles);
    state.initializeParticlesInsideBox(lower, upper);
    test.tassert( testParticleSwarmSingle(shc, state, TasDREAM::hypercube(lower, upper), iterations, -1.031628453489877) );
    if (test.failed_last()) std::cout << "ERROR: failed l1 example for Particle Swarm optimization.\n";

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Particle Swarm", "Algorithm Unit Tests");
    return test.success();
}